

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::FullyConnectedLayer::FullyConnectedLayer
          (FullyConnectedLayer *this,size_t nInputs,size_t nOutputs,Activation *af)

{
  ulong __n;
  ulong __n_00;
  valarray<float> *pvVar1;
  float *pfVar2;
  size_t sVar3;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001207a8;
  this->nInputs = nInputs;
  this->nOutputs = nOutputs;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  sVar3 = nOutputs * nInputs;
  pvVar1->_M_size = sVar3;
  __n = sVar3 * 4;
  pfVar2 = (float *)operator_new(__n);
  pvVar1->_M_data = pfVar2;
  memset(pfVar2,0,__n);
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  pvVar1->_M_size = nOutputs;
  __n_00 = nOutputs * 4;
  pfVar2 = (float *)operator_new(__n_00);
  pvVar1->_M_data = pfVar2;
  memset(pfVar2,0,__n_00);
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pvVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar1);
  this->activationFunction = af;
  (this->inducedLocalField)._M_size = nOutputs;
  pfVar2 = (float *)operator_new(__n_00);
  (this->inducedLocalField)._M_data = pfVar2;
  memset(pfVar2,0,__n_00);
  (this->activationGrad)._M_size = nOutputs;
  pfVar2 = (float *)operator_new(__n_00);
  (this->activationGrad)._M_data = pfVar2;
  memset(pfVar2,0,__n_00);
  (this->localGrad)._M_size = nOutputs;
  pfVar2 = (float *)operator_new(__n_00);
  (this->localGrad)._M_data = pfVar2;
  memset(pfVar2,0,__n_00);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  pvVar1->_M_size = sVar3;
  pfVar2 = (float *)operator_new(__n);
  pvVar1->_M_data = pfVar2;
  memset(pfVar2,0,__n);
  (this->weightSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weightSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  pvVar1->_M_size = nOutputs;
  pfVar2 = (float *)operator_new(__n_00);
  pvVar1->_M_data = pfVar2;
  memset(pfVar2,0,__n_00);
  (this->biasSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->biasSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar1);
  (this->propagatedErrors)._M_size = nInputs;
  pfVar2 = (float *)operator_new(nInputs << 2);
  (this->propagatedErrors)._M_data = pfVar2;
  memset(pfVar2,0,nInputs << 2);
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

FullyConnectedLayer(size_t nInputs = 0, size_t nOutputs = 0,
                        const Activation &af = linearActivation)
        : nInputs(nInputs), nOutputs(nOutputs),
          weights(new Array(nInputs * nOutputs)), bias(new Array(nOutputs)),
          activationFunction(&af), inducedLocalField(nOutputs),
          activationGrad(nOutputs), localGrad(nOutputs),
          weightSensitivity(new Array(nInputs * nOutputs)),
          biasSensitivity(new Array(nOutputs)),
          propagatedErrors(nInputs) {}